

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O3

void __thiscall
VPLGrammar::Parser::ForStatementNode::BuildProgram(ForStatementNode *this,Scope *scope,ostream *out)

{
  __uniq_ptr_impl<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_> _Var1;
  ostream *poVar2;
  int iVar3;
  
  iVar3 = scope->unique_id_ + 1;
  scope->unique_id_ = iVar3;
  (**(code **)(*(long *)(((this->super_ASTNodeBasic).children_.
                          super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                        ._M_t + 0x28))();
  std::__ostream_insert<char,std::char_traits<char>>(out,"func .L",7);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)out,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_for\n",5);
  _Var1._M_t.
  super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
  .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl =
       (this->super_ASTNodeBasic).children_.
       super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
       super___uniq_ptr_impl<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
       ._M_t;
  (**(code **)(*(long *)_Var1._M_t.
                        super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                        .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl +
              0x28))(_Var1._M_t.
                     super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                     .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl,scope,
                     out);
  std::__ostream_insert<char,std::char_traits<char>>(out,"    jz .L",9);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)out,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_end_for\n",9);
  std::__ostream_insert<char,std::char_traits<char>>(out,"    pop 0\n",10);
  _Var1._M_t.
  super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
  .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl =
       (this->super_ASTNodeBasic).children_.
       super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[3]._M_t.
       super___uniq_ptr_impl<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
       ._M_t;
  (**(code **)(*(long *)_Var1._M_t.
                        super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                        .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl +
              0x28))(_Var1._M_t.
                     super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                     .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl,scope,
                     out);
  _Var1._M_t.
  super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
  .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl =
       (this->super_ASTNodeBasic).children_.
       super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[2]._M_t.
       super___uniq_ptr_impl<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
       ._M_t;
  (**(code **)(*(long *)_Var1._M_t.
                        super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                        .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl +
              0x28))(_Var1._M_t.
                     super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                     .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl,scope,
                     out);
  std::__ostream_insert<char,std::char_traits<char>>(out,"    jmp .L",10);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)out,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_for\n",5);
  std::__ostream_insert<char,std::char_traits<char>>(out,"func .L",7);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)out,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_end_for\n",9);
  std::__ostream_insert<char,std::char_traits<char>>(out,"    pop 0\n",10);
  std::__ostream_insert<char,std::char_traits<char>>(out,"func .L",7);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)out,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_end\n",5);
  return;
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                int unique_id = scope->GetUnique();
                children_[0]->BuildProgram(scope, out);
                out << "func .L" << unique_id << "_for\n";
                children_[1]->BuildProgram(scope, out);
                out << "    jz .L" << unique_id << "_end_for\n";
                out << "    pop 0\n";
                children_[3]->BuildProgram(scope, out);
                children_[2]->BuildProgram(scope, out);
                out << "    jmp .L" << unique_id << "_for\n";
                out << "func .L" << unique_id << "_end_for\n";
                out << "    pop 0\n";
                out << "func .L" << unique_id << "_end\n";
            }